

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<char>::build_closure_exclusive
          (CompositeATN<char> *this,CATNClosure *closure,ATNPath *path,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  ATNPath *pAVar1;
  bool bVar2;
  int iVar3;
  int pr;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_00;
  Identifier *pIVar4;
  SimpleException *this_01;
  pair<std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>,_bool> pVar5;
  ATNPath local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [8];
  PriorityChain new_priority;
  CATNNode<char> *dest_node;
  ATNPath dest_path;
  NFATransition<char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  undefined1 local_60 [8];
  ATNPath parent;
  CATNNode<char> *node;
  PriorityChain *priority_local;
  ATNStateStack *stack_local;
  ATNPath *pAStack_20;
  int color_local;
  ATNPath *path_local;
  CATNClosure *closure_local;
  CompositeATN<char> *this_local;
  
  stack_local._4_4_ = color;
  pAStack_20 = path;
  path_local = (ATNPath *)closure;
  closure_local = (CATNClosure *)this;
  parent.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_node(this,path);
  bVar2 = CATNNode<char>::is_stop_node
                    ((CATNNode<char> *)
                     parent.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    ATNPath::parent_path((ATNPath *)local_60,pAStack_20);
    iVar3 = ATNPath::depth((ATNPath *)local_60);
    pAVar1 = path_local;
    if (iVar3 == 0) {
      pIVar4 = ATNPath::leaf_id(pAStack_20);
      build_wildcard_closure(this,(CATNClosure *)pAVar1,pIVar4,stack_local._4_4_,stack,priority);
    }
    else {
      build_closure_exclusive
                (this,(CATNClosure *)path_local,(ATNPath *)local_60,stack_local._4_4_,stack,priority
                );
    }
    ATNPath::~ATNPath((ATNPath *)local_60);
  }
  else {
    this_00 = CATNNode<char>::get_transitions
                        ((CATNNode<char> *)
                         parent.
                         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         .
                         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end0 = std::
             vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ::begin(this_00);
    tr = (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                       *)&tr), bVar2) {
      dest_path.
      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      .
      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                    ::operator*(&__end0);
      bVar2 = NFATransition<char>::is_epsilon
                        ((NFATransition<char> *)
                         dest_path.
                         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         .
                         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pAVar1 = pAStack_20;
      if (bVar2) {
        iVar3 = NFATransition<char>::dest
                          ((NFATransition<char> *)
                           dest_path.
                           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           .
                           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ATNPath::replace_index((ATNPath *)&dest_node,pAVar1,iVar3);
        new_priority.
        super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
        .
        super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)get_node(this,(ATNPath *)&dest_node);
        pIVar4 = ATNPath::leaf_id(pAStack_20);
        iVar3 = ATNPath::leaf_index(pAStack_20);
        pr = NFATransition<char>::tag
                       ((NFATransition<char> *)
                        dest_path.
                        super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                        .
                        super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        PriorityChain::add((PriorityChain *)local_d0,priority,pIVar4,iVar3,pr);
        bVar2 = CATNNode<char>::is_terminal
                          ((CATNNode<char> *)
                           new_priority.
                           super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                           .
                           super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          pVar5 = std::
                  set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                  ::emplace<Centaurus::ATNPath&,int&,Centaurus::PriorityChain&>
                            ((set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                              *)path_local,(ATNPath *)&dest_node,(int *)((long)&stack_local + 4),
                             (PriorityChain *)local_d0);
          local_e0 = (_Base_ptr)pVar5.first._M_node;
          local_d8 = pVar5.second;
          build_closure_exclusive
                    (this,(CATNClosure *)path_local,(ATNPath *)&dest_node,stack_local._4_4_,stack,
                     (PriorityChain *)local_d0);
        }
        else {
          pIVar4 = ATNPath::leaf_id(pAStack_20);
          iVar3 = NFATransition<char>::dest
                            ((NFATransition<char> *)
                             dest_path.
                             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                             .
                             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar3 = ATNPath::count((ATNPath *)&dest_node,pIVar4,iVar3);
          pAVar1 = path_local;
          if (1 < iVar3) {
            local_102 = 1;
            this_01 = (SimpleException *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_100,"Downward sentinel reached.",&local_101);
            SimpleException::SimpleException(this_01,&local_100);
            local_102 = 0;
            __cxa_throw(this_01,&SimpleException::typeinfo,SimpleException::~SimpleException);
          }
          pIVar4 = CATNNode<char>::get_submachine
                             ((CATNNode<char> *)
                              new_priority.
                              super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                              .
                              super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ATNPath::add(&local_128,(ATNPath *)&dest_node,pIVar4,0);
          build_closure_inclusive
                    (this,(CATNClosure *)pAVar1,&local_128,stack_local._4_4_,stack,
                     (PriorityChain *)local_d0);
          ATNPath::~ATNPath(&local_128);
        }
        PriorityChain::~PriorityChain((PriorityChain *)local_d0);
        ATNPath::~ATNPath((ATNPath *)&dest_node);
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_closure_exclusive(CATNClosure& closure, const ATNPath& path, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    //std::wcout << L"Exclusive " << path << L":" << color << std::endl;

    if (node.is_stop_node())
    {
        //std::wcout << L"Stop node " << path << std::endl;

        ATNPath parent = path.parent_path();

        if (parent.depth() == 0)
        {
            build_wildcard_closure(closure, path.leaf_id(), color, stack, priority);
        }
        else
        {
            build_closure_exclusive(closure, parent, color, stack, priority);
        }
    }
    else
    {
        //std::wcout << L"Intermediate node " << path << std::endl;

        for (const auto& tr : node.get_transitions())
        {
            if (tr.is_epsilon())
            {
                ATNPath dest_path = path.replace_index(tr.dest());

                const CATNNode<TCHAR>& dest_node = get_node(dest_path);

                PriorityChain new_priority = priority.add(path.leaf_id(), path.leaf_index(), tr.tag());

                if (dest_node.is_terminal())
                {
                    closure.emplace(dest_path, color, new_priority);

                    build_closure_exclusive(closure, dest_path, color, stack, new_priority);
                }
                else
                {
                    if (dest_path.count(path.leaf_id(), tr.dest()) >= 2)
                    {
                        throw SimpleException("Downward sentinel reached.");
                    }

                    build_closure_inclusive(closure, dest_path.add(dest_node.get_submachine(), 0), color, stack, new_priority);
                }
            }
        }
    }
}